

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.h
# Opt level: O1

void __thiscall CTextCursor::CTextCursor(CTextCursor *this)

{
  (this->m_Glyphs).list = (CScaledGlyph *)0x0;
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::clear(&this->m_Glyphs);
  this->m_FontSize = 10.0;
  this->m_MaxLines = 1;
  this->m_MaxWidth = -1.0;
  (this->m_CursorPos).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  (this->m_CursorPos).field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  this->m_LineSpacing = 0.0;
  this->m_Align = 0;
  this->m_Flags = 0;
  Reset(this,-1);
  return;
}

Assistant:

CTextCursor() { Set(10.0f, 0, 0, 0); Reset(); }